

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

cbtHullTriangle * ConvexDecomposition::extrudable(float epsilon)

{
  long lVar1;
  cbtHullTriangle *pcVar2;
  cbtHullTriangle *pcVar3;
  ulong uVar4;
  
  uVar4 = 0;
  pcVar3 = (cbtHullTriangle *)0x0;
  do {
    if ((pcVar3 == (cbtHullTriangle *)0x0) ||
       ((lVar1 = *(long *)(tris + uVar4 * 8), lVar1 != 0 &&
        (pcVar3->rise < *(float *)(lVar1 + 0x20))))) {
      pcVar3 = *(cbtHullTriangle **)(tris + uVar4 * 8);
    }
    uVar4 = uVar4 + 1;
  } while (DAT_00b98040 != uVar4);
  pcVar2 = (cbtHullTriangle *)0x0;
  if (epsilon < pcVar3->rise) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

cbtHullTriangle *extrudable(float epsilon)
{
	int i;
	cbtHullTriangle *t=NULL;
	for(i=0;i<tris.count;i++)
	{
		if(!t || (tris[i] && t->rise<tris[i]->rise))
		{
			t = tris[i];
		}
	}
	return (t->rise >epsilon)?t:NULL ;
}